

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O1

int archive_read_format_iso9660_bid(archive_read *a,int best_bid)

{
  uchar *__s1;
  byte bVar1;
  ushort uVar2;
  iso9660 *iso9660;
  long lVar3;
  char cVar4;
  uint p0;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  vd *pvVar8;
  uint32_t *puVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  byte *h;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ssize_t bytes_read;
  long local_50;
  vd *local_48;
  uint32_t *local_40;
  uint32_t *local_38;
  
  iVar5 = -1;
  if (best_bid < 0x31) {
    iso9660 = (iso9660 *)a->format->data;
    pvVar7 = __archive_read_ahead(a,0xc000,&local_50);
    if (pvVar7 != (void *)0x0) {
      if (0x8800 < local_50) {
        h = (byte *)((long)pvVar7 + 0x8000);
        __s1 = iso9660->null;
        local_48 = &iso9660->primary;
        local_40 = &(iso9660->primary).size;
        local_38 = &(iso9660->joliet).size;
        lVar3 = local_50 + -0x8800;
        local_50 = local_50 + -0x8000;
        do {
          lVar12 = lVar3;
          bVar1 = *h;
          if ((3 < bVar1) && (bVar1 != 0xff)) {
            return 0;
          }
          if (h[5] != 0x31 || *(int *)(h + 1) != 0x30304443) {
            return 0;
          }
          if (((((bVar1 == 1) && (h[6] == 1)) && (h[7] == 0)) &&
              ((((*(long *)__s1 == *(long *)(h + 0x48) && (h[0x50] == h[0x57])) &&
                ((h[0x51] == h[0x56] && ((h[0x52] == h[0x55] && (h[0x53] == h[0x54])))))) &&
               (uVar10 = CONCAT13(h[0x53],CONCAT12(h[0x52],CONCAT11(h[0x51],h[0x50]))),
               0x14 < (int)uVar10)))) &&
             (((((((auVar15[0] = -(h[0x58] == *__s1), auVar15[1] = -(h[0x59] == iso9660->null[1]),
                   auVar15[2] = -(h[0x5a] == iso9660->null[2]),
                   auVar15[3] = -(h[0x5b] == iso9660->null[3]),
                   auVar15[4] = -(h[0x5c] == iso9660->null[4]),
                   auVar15[5] = -(h[0x5d] == iso9660->null[5]),
                   auVar15[6] = -(h[0x5e] == iso9660->null[6]),
                   auVar15[7] = -(h[0x5f] == iso9660->null[7]),
                   auVar15[8] = -(h[0x60] == iso9660->null[8]),
                   auVar15[9] = -(h[0x61] == iso9660->null[9]),
                   auVar15[10] = -(h[0x62] == iso9660->null[10]),
                   auVar15[0xb] = -(h[99] == iso9660->null[0xb]),
                   auVar15[0xc] = -(h[100] == iso9660->null[0xc]),
                   auVar15[0xd] = -(h[0x65] == iso9660->null[0xd]),
                   auVar15[0xe] = -(h[0x66] == iso9660->null[0xe]),
                   auVar15[0xf] = -(h[0x67] == iso9660->null[0xf]),
                   auVar13[0] = -(h[0x68] == iso9660->null[0x10]),
                   auVar13[1] = -(h[0x69] == iso9660->null[0x11]),
                   auVar13[2] = -(h[0x6a] == iso9660->null[0x12]),
                   auVar13[3] = -(h[0x6b] == iso9660->null[0x13]),
                   auVar13[4] = -(h[0x6c] == iso9660->null[0x14]),
                   auVar13[5] = -(h[0x6d] == iso9660->null[0x15]),
                   auVar13[6] = -(h[0x6e] == iso9660->null[0x16]),
                   auVar13[7] = -(h[0x6f] == iso9660->null[0x17]),
                   auVar13[8] = -(h[0x70] == iso9660->null[0x18]),
                   auVar13[9] = -(h[0x71] == iso9660->null[0x19]),
                   auVar13[10] = -(h[0x72] == iso9660->null[0x1a]),
                   auVar13[0xb] = -(h[0x73] == iso9660->null[0x1b]),
                   auVar13[0xc] = -(h[0x74] == iso9660->null[0x1c]),
                   auVar13[0xd] = -(h[0x75] == iso9660->null[0x1d]),
                   auVar13[0xe] = -(h[0x76] == iso9660->null[0x1e]),
                   auVar13[0xf] = -(h[0x77] == iso9660->null[0x1f]), auVar13 = auVar13 & auVar15,
                   (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff &&
                   (h[0x78] == h[0x7b])) && (h[0x79] == h[0x7a])) &&
                 ((h[0x7c] == h[0x7f] && (h[0x7d] == h[0x7e])))) &&
                ((h[0x80] == h[0x83] &&
                 ((h[0x81] == h[0x82] && (uVar2 = CONCAT11(h[0x81],h[0x80]), uVar2 != 0)))))) &&
               (iVar5 = isValid733Integer(h + 0x84), iVar5 != 0)) &&
              ((((((h[0x371] == 1 && (0x11 < *(int *)(h + 0x8c))) &&
                  (*(int *)(h + 0x8c) < (int)uVar10)) &&
                 ((uVar6 = *(uint *)(h + 0x94),
                  uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                          uVar6 << 0x18, (int)uVar6 < (int)uVar10 && uVar6 - 0x12 < 0xffffffef &&
                  ((h[0x372] & 0xdf) == 0)))) && (iVar5 = bcmp(__s1,h + 0x573,0x28d), iVar5 == 0))
               && (iVar5 = isRootDirectoryRecord(h + 0x9c), iVar5 != 0)))))) {
            if (local_48->location != 0) goto LAB_00136d21;
            iso9660->logical_block_size = (ulong)uVar2;
            iso9660->volume_block = uVar10;
            iso9660->volume_size = (ulong)uVar10 * (ulong)uVar2;
            pvVar8 = local_48;
            puVar9 = local_40;
LAB_00136ded:
            pvVar8->location = *(int *)(h + 0x9e);
            *puVar9 = *(uint32_t *)(h + 0xa6);
          }
          else {
            if ((((iso9660->joliet).location == 0) && (iVar5 = isSVD(iso9660,h), iVar5 != 0)) &&
               ((h[0x58] == 0x25 && (h[0x59] == 0x2f)))) {
              bVar1 = h[0x5a];
              if (bVar1 == 0x40) {
                cVar4 = '\x01';
              }
              else if (bVar1 == 0x45) {
                cVar4 = '\x03';
              }
              else {
                if (bVar1 != 0x43) goto LAB_00136c5a;
                cVar4 = '\x02';
              }
              iso9660->seenJoliet = cVar4;
              uVar2 = *(ushort *)(h + 0x80);
              uVar11 = (ulong)h[0x51] << 8 |
                       (long)(int)((uint)h[0x53] << 0x18) | (ulong)h[0x52] << 0x10 | (ulong)h[0x50];
              iso9660->logical_block_size = (ulong)uVar2;
              iso9660->volume_block = (int32_t)uVar11;
              iso9660->volume_size = uVar11 * uVar2;
              pvVar8 = &iso9660->joliet;
              puVar9 = local_38;
              goto LAB_00136ded;
            }
LAB_00136c5a:
            bVar1 = *h;
            if (bVar1 == 2) {
              if ((((h[6] != 2) || (h[7] != 0)) || (*(long *)__s1 != *(long *)(h + 0x48))) ||
                 (((((auVar16[0] = -(h[0x58] == *__s1), auVar16[1] = -(h[0x59] == iso9660->null[1]),
                     auVar16[2] = -(h[0x5a] == iso9660->null[2]),
                     auVar16[3] = -(h[0x5b] == iso9660->null[3]),
                     auVar16[4] = -(h[0x5c] == iso9660->null[4]),
                     auVar16[5] = -(h[0x5d] == iso9660->null[5]),
                     auVar16[6] = -(h[0x5e] == iso9660->null[6]),
                     auVar16[7] = -(h[0x5f] == iso9660->null[7]),
                     auVar16[8] = -(h[0x60] == iso9660->null[8]),
                     auVar16[9] = -(h[0x61] == iso9660->null[9]),
                     auVar16[10] = -(h[0x62] == iso9660->null[10]),
                     auVar16[0xb] = -(h[99] == iso9660->null[0xb]),
                     auVar16[0xc] = -(h[100] == iso9660->null[0xc]),
                     auVar16[0xd] = -(h[0x65] == iso9660->null[0xd]),
                     auVar16[0xe] = -(h[0x66] == iso9660->null[0xe]),
                     auVar16[0xf] = -(h[0x67] == iso9660->null[0xf]),
                     auVar14[0] = -(h[0x68] == iso9660->null[0x10]),
                     auVar14[1] = -(h[0x69] == iso9660->null[0x11]),
                     auVar14[2] = -(h[0x6a] == iso9660->null[0x12]),
                     auVar14[3] = -(h[0x6b] == iso9660->null[0x13]),
                     auVar14[4] = -(h[0x6c] == iso9660->null[0x14]),
                     auVar14[5] = -(h[0x6d] == iso9660->null[0x15]),
                     auVar14[6] = -(h[0x6e] == iso9660->null[0x16]),
                     auVar14[7] = -(h[0x6f] == iso9660->null[0x17]),
                     auVar14[8] = -(h[0x70] == iso9660->null[0x18]),
                     auVar14[9] = -(h[0x71] == iso9660->null[0x19]),
                     auVar14[10] = -(h[0x72] == iso9660->null[0x1a]),
                     auVar14[0xb] = -(h[0x73] == iso9660->null[0x1b]),
                     auVar14[0xc] = -(h[0x74] == iso9660->null[0x1c]),
                     auVar14[0xd] = -(h[0x75] == iso9660->null[0x1d]),
                     auVar14[0xe] = -(h[0x76] == iso9660->null[0x1e]),
                     auVar14[0xf] = -(h[0x77] == iso9660->null[0x1f]), auVar14 = auVar14 & auVar16,
                     (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff ||
                     (h[0x80] == 0 && h[0x81] == 0)) ||
                    ((iVar5 = *(int *)(h + 0x50), iVar5 < 0x15 ||
                     ((h[0x371] != 2 || (*(int *)(h + 0x8c) < 0x12)))))) ||
                   ((iVar5 <= *(int *)(h + 0x8c) ||
                    (((uVar10 = *(uint *)(h + 0x94),
                      uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                               uVar10 << 0x18, iVar5 <= (int)uVar10 || 0xffffffee < uVar10 - 0x12 ||
                      (*__s1 != h[0x372])) || (iVar5 = bcmp(__s1,h + 0x573,0x28d), iVar5 != 0))))))
                  || (iVar5 = isRootDirectoryRecord(h + 0x9c), iVar5 == 0)))) goto LAB_00136ccb;
            }
            else if ((bVar1 != 0) || (h[6] != 1)) {
LAB_00136ccb:
              iVar5 = isSVD(iso9660,h);
              if ((iVar5 == 0) &&
                 (((bVar1 != 3 || (h[6] != 1)) ||
                  ((h[7] != 0 ||
                   (((uVar10 = *(uint *)(h + 0x48), (int)uVar10 < 0x11 ||
                     (iso9660->volume_block <= (int)uVar10)) ||
                    (uVar6 = *(uint *)(h + 0x4c),
                    uVar10 != (uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                              uVar6 << 0x18))))))))) {
                iVar5 = isVDSetTerminator(iso9660,h);
                if (iVar5 == 0) {
                  return 0;
                }
                if (0x10 < (iso9660->primary).location) {
                  return 0x30;
                }
                break;
              }
            }
          }
LAB_00136d21:
          h = h + 0x800;
          lVar3 = lVar12 + -0x800;
          local_50 = lVar12;
        } while (0x1000 < lVar12 + 0x800);
      }
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static int
archive_read_format_iso9660_bid(struct archive_read *a, int best_bid)
{
	struct iso9660 *iso9660;
	ssize_t bytes_read;
	const unsigned char *p;
	int seenTerminator;

	/* If there's already a better bid than we can ever
	   make, don't bother testing. */
	if (best_bid > 48)
		return (-1);

	iso9660 = (struct iso9660 *)(a->format->data);

	/*
	 * Skip the first 32k (reserved area) and get the first
	 * 8 sectors of the volume descriptor table.  Of course,
	 * if the I/O layer gives us more, we'll take it.
	 */
#define RESERVED_AREA	(SYSTEM_AREA_BLOCK * LOGICAL_BLOCK_SIZE)
	p = __archive_read_ahead(a,
	    RESERVED_AREA + 8 * LOGICAL_BLOCK_SIZE,
	    &bytes_read);
	if (p == NULL)
	    return (-1);

	/* Skip the reserved area. */
	bytes_read -= RESERVED_AREA;
	p += RESERVED_AREA;

	/* Check each volume descriptor. */
	seenTerminator = 0;
	for (; bytes_read > LOGICAL_BLOCK_SIZE;
	    bytes_read -= LOGICAL_BLOCK_SIZE, p += LOGICAL_BLOCK_SIZE) {
		/* Do not handle undefined Volume Descriptor Type. */
		if (p[0] >= 4 && p[0] <= 254)
			return (0);
		/* Standard Identifier must be "CD001" */
		if (memcmp(p + 1, "CD001", 5) != 0)
			return (0);
		if (isPVD(iso9660, p))
			continue;
		if (!iso9660->joliet.location) {
			if (isJolietSVD(iso9660, p))
				continue;
		}
		if (isBootRecord(iso9660, p))
			continue;
		if (isEVD(iso9660, p))
			continue;
		if (isSVD(iso9660, p))
			continue;
		if (isVolumePartition(iso9660, p))
			continue;
		if (isVDSetTerminator(iso9660, p)) {
			seenTerminator = 1;
			break;
		}
		return (0);
	}
	/*
	 * ISO 9660 format must have Primary Volume Descriptor and
	 * Volume Descriptor Set Terminator.
	 */
	if (seenTerminator && iso9660->primary.location > 16)
		return (48);

	/* We didn't find a valid PVD; return a bid of zero. */
	return (0);
}